

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O1

void __thiscall
S2RegionCoverer::AdjustCellLevels
          (S2RegionCoverer *this,vector<S2CellId,_std::allocator<S2CellId>_> *cells)

{
  int iVar1;
  int iVar2;
  pointer pSVar3;
  ulong uVar4;
  uint64 *puVar5;
  long lVar6;
  S2RegionCoverer *pSVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  pointer pSVar11;
  ulong __new_size;
  int level;
  pointer pSVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  S2CellId id;
  S2CellId local_58;
  S2RegionCoverer *local_50;
  pointer local_48;
  S2LogMessage local_40;
  
  pSVar12 = (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pSVar3 = (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar11 = pSVar3;
  if (pSVar12 != pSVar3) {
    do {
      pSVar11 = pSVar12 + 1;
      if (pSVar11 == pSVar3) break;
      puVar5 = &pSVar12->id_;
      pSVar12 = pSVar11;
    } while (*puVar5 <= pSVar11->id_);
  }
  if (pSVar11 != pSVar3) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0xc5,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: is_sorted(cells->begin(), cells->end()) ",0x36);
LAB_00221842:
    abort();
  }
  if ((this->options_).level_mod_ != 1) {
    pSVar12 = (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_48 = (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    __new_size = 0;
    pSVar7 = this;
    if (pSVar12 != local_48) {
      do {
        local_50 = pSVar7;
        local_58.id_ = pSVar12->id_;
        if (local_58.id_ == 0) {
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                     ,0x223,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40.stream_,"Check failed: id_ != 0 ",0x17);
          goto LAB_00221842;
        }
        uVar4 = 0;
        if (local_58.id_ != 0) {
          for (; (local_58.id_ >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        iVar10 = 0x1e - ((uint)(uVar4 >> 1) & 0x7fffffff);
        iVar1 = (this->options_).level_mod_;
        level = iVar10;
        if ((1 < iVar1) &&
           (iVar2 = (this->options_).min_level_, iVar9 = iVar10 - iVar2,
           iVar9 != 0 && iVar2 <= iVar10)) {
          level = iVar10 - iVar9 % iVar1;
        }
        if (level != iVar10) {
          local_58 = S2CellId::parent(&local_58,level);
        }
        uVar13 = (uint)__new_size;
        if (((int)uVar13 < 1) ||
           (bVar8 = S2CellId::contains((cells->
                                       super__Vector_base<S2CellId,_std::allocator<S2CellId>_>).
                                       _M_impl.super__Vector_impl_data._M_start + (__new_size - 1),
                                       local_58), !bVar8)) {
          uVar14 = uVar13 + 1;
          do {
            uVar15 = (int)uVar13 >> 0x1f & uVar13;
            if ((int)__new_size < 1) break;
            lVar6 = __new_size - 1;
            __new_size = __new_size - 1;
            bVar8 = S2CellId::contains(&local_58,
                                       (S2CellId)
                                       (cells->
                                       super__Vector_base<S2CellId,_std::allocator<S2CellId>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar6].id_);
            uVar14 = uVar14 - 1;
            uVar15 = uVar14;
          } while (bVar8);
          __new_size = (ulong)(uVar15 + 1);
          (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
          super__Vector_impl_data._M_start[(int)uVar15].id_ = local_58.id_;
          this = local_50;
        }
        pSVar12 = pSVar12 + 1;
        pSVar7 = local_50;
      } while (pSVar12 != local_48);
      __new_size = (ulong)(int)__new_size;
    }
    std::vector<S2CellId,_std::allocator<S2CellId>_>::resize(cells,__new_size);
  }
  return;
}

Assistant:

void S2RegionCoverer::AdjustCellLevels(vector<S2CellId>* cells) const {
  S2_DCHECK(is_sorted(cells->begin(), cells->end()));
  if (options_.level_mod() == 1) return;

  int out = 0;
  for (S2CellId id : *cells) {
    int level = id.level();
    int new_level = AdjustLevel(level);
    if (new_level != level) id = id.parent(new_level);
    if (out > 0 && (*cells)[out-1].contains(id)) continue;
    while (out > 0 && id.contains((*cells)[out-1])) --out;
    (*cells)[out++] = id;
  }
  cells->resize(out);
}